

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O2

path * __thiscall
FlatFileSeq::FileName(path *__return_storage_ptr__,FlatFileSeq *this,FlatFilePos *pos)

{
  int *in_R8;
  long in_FS_OFFSET;
  string local_d8;
  path local_b8;
  path local_90;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_68;
  path local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_90,(path *)this);
  tinyformat::format<char_const*,int>
            (&local_d8,(tinyformat *)"%s%05u.dat",(char *)&this->m_prefix,(char **)pos,in_R8);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_68,local_d8._M_dataplus._M_p,
             local_d8._M_dataplus._M_p + local_d8._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (&local_48,&local_68,auto_format);
  std::filesystem::__cxx11::path::path(&local_b8,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::__cxx11::u8string::~u8string((u8string *)&local_68);
  std::filesystem::__cxx11::path::operator/=(&local_90,(path *)&local_b8);
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->super_path,&local_90);
  std::filesystem::__cxx11::path::~path(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::filesystem::__cxx11::path::~path(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

fs::path FlatFileSeq::FileName(const FlatFilePos& pos) const
{
    return m_dir / fs::u8path(strprintf("%s%05u.dat", m_prefix, pos.nFile));
}